

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void Interrupt(NodeContext *node)

{
  long lVar1;
  bool bVar2;
  __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_> *__lhs;
  reference ppBVar3;
  long in_RDI;
  long in_FS_OFFSET;
  BaseIndex *index;
  vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *__range1;
  iterator __end1;
  iterator __begin1;
  BaseIndex *in_stack_ffffffffffffffc8;
  BaseIndex *in_stack_ffffffffffffffd0;
  CConnman *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ShutdownNotify((ArgsManager *)__range1);
  InterruptHTTPServer();
  InterruptHTTPRPC();
  InterruptRPC();
  InterruptREST();
  InterruptTorControl();
  InterruptMapPort();
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
                     in_stack_ffffffffffffffc8);
  if (bVar2) {
    std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::operator->
              ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)in_stack_ffffffffffffffc8);
    CConnman::Interrupt(in_stack_ffffffffffffffd8);
  }
  __lhs = (__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
           *)(in_RDI + 0x68);
  std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::begin
            ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)in_stack_ffffffffffffffd0);
  std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>::end
            ((vector<BaseIndex_*,_std::allocator<BaseIndex_*>_> *)in_stack_ffffffffffffffd0);
  while (bVar2 = __gnu_cxx::
                 operator==<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                           (__lhs,(__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                                   *)in_stack_ffffffffffffffd0), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppBVar3 = __gnu_cxx::
              __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
              ::operator*((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                           *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = *ppBVar3;
    BaseIndex::Interrupt(in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>::
    operator++((__normal_iterator<BaseIndex_**,_std::vector<BaseIndex_*,_std::allocator<BaseIndex_*>_>_>
                *)in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Interrupt(NodeContext& node)
{
#if HAVE_SYSTEM
    ShutdownNotify(*node.args);
#endif
    InterruptHTTPServer();
    InterruptHTTPRPC();
    InterruptRPC();
    InterruptREST();
    InterruptTorControl();
    InterruptMapPort();
    if (node.connman)
        node.connman->Interrupt();
    for (auto* index : node.indexes) {
        index->Interrupt();
    }
}